

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall EquationOr::~EquationOr(EquationOr *this)

{
  (this->super_PatternEquation)._vptr_PatternEquation = (_func_int **)&PTR__EquationOr_00400738;
  PatternEquation::release(this->left);
  PatternEquation::release(this->right);
  PatternEquation::~PatternEquation(&this->super_PatternEquation);
  return;
}

Assistant:

EquationOr::~EquationOr(void)

{
  PatternEquation::release(left);
  PatternEquation::release(right);
}